

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void ScalePlaneBilinearDown
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  void *pvVar2;
  code *pcVar3;
  long lVar4;
  uint8_t *puVar5;
  code *pcVar6;
  uint8_t *puVar7;
  uint uVar8;
  bool bVar9;
  uint local_6c;
  uint local_68;
  int local_64;
  int dx;
  int x;
  int local_58;
  int dy;
  int local_50;
  int local_4c;
  void *local_48;
  long local_40;
  code *local_38;
  
  x = 0;
  local_6c = 0;
  dx = 0;
  dy = 0;
  local_64 = dst_width;
  local_58 = src_stride;
  local_4c = dst_stride;
  pvVar2 = malloc((long)(src_width + 0x3f));
  if (src_width < 0x8000) {
    pcVar3 = ScaleFilterCols_C;
  }
  else {
    pcVar3 = ScaleFilterCols64_C;
  }
  local_50 = dst_height;
  ScaleSlope(src_width,src_height,local_64,dst_height,filtering,&x,(int *)&local_6c,&dx,&dy);
  local_68 = -src_width;
  if (0 < src_width) {
    local_68 = src_width;
  }
  iVar1 = libyuv::TestCpuFlag(0x40);
  if ((local_68 & 0xf) == 0) {
    pcVar6 = InterpolateRow_SSSE3;
  }
  else {
    pcVar6 = InterpolateRow_Any_SSSE3;
  }
  if (iVar1 == 0) {
    pcVar6 = InterpolateRow_C;
  }
  iVar1 = libyuv::TestCpuFlag(0x400);
  if ((local_68 & 0x1f) == 0) {
    local_38 = InterpolateRow_AVX2;
  }
  else {
    local_38 = InterpolateRow_Any_AVX2;
  }
  uVar8 = src_height * 0x10000 - 0x10000;
  if (iVar1 == 0) {
    local_38 = pcVar6;
  }
  iVar1 = libyuv::TestCpuFlag(0x40);
  pcVar6 = pcVar3;
  if (iVar1 != 0) {
    pcVar6 = ScaleFilterCols_SSSE3;
  }
  if (local_68 < 0x8000) {
    pcVar3 = pcVar6;
  }
  if ((int)uVar8 < (int)local_6c) {
    local_6c = uVar8;
  }
  puVar7 = (uint8_t *)((long)pvVar2 + 0x3fU & 0xffffffffffffffc0);
  local_40 = (long)local_58;
  lVar4 = (long)local_4c;
  iVar1 = 0;
  local_48 = pvVar2;
  if (0 < local_50) {
    iVar1 = local_50;
  }
  while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
    puVar5 = src_ptr + ((int)local_6c >> 0x10) * local_58;
    if (filtering != kFilterLinear) {
      (*local_38)(puVar7,puVar5,local_40,local_68,local_6c >> 8 & 0xff);
      puVar5 = puVar7;
    }
    (*pcVar3)(dst_ptr,puVar5,local_64,x,dx);
    dst_ptr = dst_ptr + lVar4;
    local_6c = local_6c + dy;
    if ((int)uVar8 <= (int)local_6c) {
      local_6c = uVar8;
    }
  }
  free(local_48);
  return;
}

Assistant:

void ScalePlaneBilinearDown(int src_width,
                            int src_height,
                            int dst_width,
                            int dst_height,
                            int src_stride,
                            int dst_stride,
                            const uint8_t* src_ptr,
                            uint8_t* dst_ptr,
                            enum FilterMode filtering) {
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  // TODO(fbarchard): Consider not allocating row buffer for kFilterLinear.
  // Allocate a row buffer.
  align_buffer_64(row, src_width);

  const int max_y = (src_height - 1) << 16;
  int j;
  void (*ScaleFilterCols)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                          int dst_width, int x, int dx) =
      (src_width >= 32768) ? ScaleFilterCols64_C : ScaleFilterCols_C;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

#if defined(HAS_SCALEFILTERCOLS_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_NEON)
  if (TestCpuFlag(kCpuHasNEON) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_MSA)
  if (TestCpuFlag(kCpuHasMSA) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleFilterCols = ScaleFilterCols_MSA;
    }
  }
#endif
  if (y > max_y) {
    y = max_y;
  }

  for (j = 0; j < dst_height; ++j) {
    int yi = y >> 16;
    const uint8_t* src = src_ptr + yi * src_stride;
    if (filtering == kFilterLinear) {
      ScaleFilterCols(dst_ptr, src, dst_width, x, dx);
    } else {
      int yf = (y >> 8) & 255;
      InterpolateRow(row, src, src_stride, src_width, yf);
      ScaleFilterCols(dst_ptr, row, dst_width, x, dx);
    }
    dst_ptr += dst_stride;
    y += dy;
    if (y > max_y) {
      y = max_y;
    }
  }
  free_aligned_buffer_64(row);
}